

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraint.cpp
# Opt level: O3

ChEnumMapper<chrono::eChConstraintMode> * __thiscall
chrono::eChConstraintMode_mapper::operator()
          (ChEnumMapper<chrono::eChConstraintMode> *__return_storage_ptr__,
          eChConstraintMode_mapper *this,eChConstraintMode *mval)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  
  peVar1 = (this->super_ChEnumMapper<chrono::eChConstraintMode>).enummap.
           super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (this->super_ChEnumMapper<chrono::eChConstraintMode>).enummap.
            super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->super_ChEnumMapperBase)._vptr_ChEnumMapperBase =
         (_func_int **)&PTR_GetValueAsInt_00b3ace8;
    __return_storage_ptr__->value_ptr = (eChConstraintMode *)0x0;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_007d4815;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded != '\0';
    (__return_storage_ptr__->super_ChEnumMapperBase)._vptr_ChEnumMapperBase =
         (_func_int **)&PTR_GetValueAsInt_00b3ace8;
    __return_storage_ptr__->value_ptr = (eChConstraintMode *)0x0;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
    if (bVar2) goto LAB_007d4806;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (__return_storage_ptr__->super_ChEnumMapperBase)._vptr_ChEnumMapperBase =
         (_func_int **)&PTR_GetValueAsInt_00b3ace8;
    __return_storage_ptr__->value_ptr = (eChConstraintMode *)0x0;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
LAB_007d4806:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_007d4815:
  __return_storage_ptr__->value_ptr = mval;
  return __return_storage_ptr__;
}

Assistant:

void ChConstraint::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraint>();

    // serialize all member data:
    marchive << CHNVP(cfm_i);
    marchive << CHNVP(valid);
    marchive << CHNVP(disabled);
    marchive << CHNVP(redundant);
    marchive << CHNVP(broken);
    eChConstraintMode_mapper typemapper;
    marchive << CHNVP(typemapper(this->mode), "mode");
}